

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O2

QString * __thiscall
QTranslatorPrivate::do_translate
          (QString *__return_storage_ptr__,QTranslatorPrivate *this,char *context,char *sourceText,
          char *comment,int n)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  pointer puVar4;
  QTranslator *pQVar5;
  uchar *puVar6;
  uint *puVar7;
  qsizetype n_00;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  uint *puVar12;
  size_t sVar13;
  size_t sVar14;
  QChar *dest;
  uint targetLen;
  uint *puVar15;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  uint foundLen;
  unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *translator;
  pointer puVar19;
  uint *puVar20;
  int iVar21;
  uint uVar22;
  byte bVar23;
  ushort *puVar24;
  uchar *puVar25;
  byte bVar26;
  ushort uVar27;
  long in_FS_OFFSET;
  int local_a4;
  uchar *local_90;
  ulong local_78;
  int local_5c;
  quint32 h;
  long local_38;
  
  if (context == (char *)0x0) {
    context = "";
  }
  if (sourceText == (char *)0x0) {
    sourceText = "";
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (comment == (char *)0x0) {
    comment = "";
  }
  uVar3 = this->offsetLength;
  if (uVar3 == 0) {
LAB_002a1e05:
    puVar4 = (this->subTranslators).
             super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (this->subTranslators).
                   super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar4;
        puVar19 = puVar19 + 1) {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
      pQVar5 = (puVar19->_M_t).super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>
               ._M_t.super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
               super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl;
      (**(code **)((long)(pQVar5->super_QObject)._vptr_QObject + 0x60))
                (__return_storage_ptr__,pQVar5,context,sourceText,comment,n);
      if ((__return_storage_ptr__->d).ptr != (char16_t *)0x0) goto LAB_002a22fd;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    }
  }
  else {
    if (this->contextLength == 0) {
LAB_002a1def:
      if (7 < uVar3) {
        local_a4 = 0;
        pcVar18 = comment;
        if ((-1 < n) && (this->numerusRulesLength != 0)) {
          puVar6 = this->numerusRulesArray;
          uVar17 = 0;
          local_a4 = 0;
          while( true ) {
            bVar1 = 0;
            do {
              bVar23 = bVar1;
              bVar26 = 1;
              do {
                iVar21 = (int)uVar17;
                bVar1 = puVar6[uVar17];
                uVar9 = (uint)n % 10;
                if (((((bVar1 & 0x10) == 0) && (uVar9 = (uint)n % 100, (bVar1 & 0x20) == 0)) &&
                    (uVar9 = n, 999 < (uint)n)) && (uVar16 = n, (bVar1 & 0x40) != 0)) {
                  do {
                    uVar9 = uVar16 / 1000;
                    bVar8 = 999999 < uVar16;
                    uVar16 = uVar9;
                  } while (bVar8);
                }
                uVar22 = bVar1 & 7;
                uVar16 = iVar21 + 2;
                if (uVar22 - 1 < 4) {
                  uVar10 = (uint)puVar6[iVar21 + 1];
                  switch(uVar22) {
                  case 1:
                    bVar8 = uVar9 == puVar6[iVar21 + 1];
                    break;
                  case 2:
                    bVar8 = (int)uVar9 < (int)uVar10;
                    break;
                  case 3:
                    bVar8 = (int)uVar9 <= (int)uVar10;
                    break;
                  case 4:
                    bVar8 = (int)uVar9 <= (int)(uint)puVar6[uVar16] && (int)uVar10 <= (int)uVar9;
                    uVar16 = iVar21 + 3;
                  }
                }
                else {
                  bVar8 = true;
                }
                bVar26 = bVar26 & ((byte)((bVar1 & 8) >> 3) ^ bVar8);
                if (uVar16 == this->numerusRulesLength) {
                  local_a4 = local_a4 + ((byte)~(bVar23 | bVar26) & 1);
                  goto LAB_002a201c;
                }
                uVar17 = (ulong)(uVar16 + 1);
              } while (puVar6[uVar16] == 0xfd);
              bVar1 = bVar23 | bVar26;
            } while (puVar6[uVar16] == 0xfe);
            if (bVar23 != 0 || bVar26 != 0) break;
            local_a4 = local_a4 + 1;
          }
        }
LAB_002a201c:
        do {
          comment = pcVar18;
          h = 0;
          elfHash_continue(sourceText,&h);
          elfHash_continue(comment,&h);
          uVar9 = h + (h == 0);
          puVar7 = (uint *)this->offsetArray;
          puVar15 = (uint *)((long)puVar7 + ((ulong)(uVar3 & 0xfffffff8) - 8));
          puVar20 = puVar7;
          do {
            puVar12 = puVar20;
            if (puVar15 < puVar12) goto LAB_002a20a3;
            uVar17 = (long)puVar15 - (long)puVar12 >> 1 & 0xfffffffffffffff8;
            uVar16 = *(uint *)((long)puVar12 + uVar17);
            uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                     uVar16 << 0x18;
            puVar20 = (uint *)((long)puVar12 + uVar17) + 2;
            if (uVar9 <= uVar16) {
              puVar20 = puVar12;
            }
            if (uVar9 < uVar16) {
              puVar15 = (uint *)((long)puVar12 + (uVar17 - 8));
            }
          } while (uVar16 != uVar9);
          puVar12 = (uint *)((long)puVar12 + uVar17);
LAB_002a20a3:
          h = uVar9;
          if (puVar12 <= puVar15) {
            do {
              puVar20 = puVar12;
              puVar15 = puVar7;
              if (puVar20 == puVar7) break;
              puVar12 = puVar20 + -2;
              puVar15 = puVar20;
            } while (*puVar20 == puVar20[-2]);
            while ((puVar15 < this->offsetArray + this->offsetLength &&
                   (uVar16 = *puVar15,
                   (uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                   uVar16 << 0x18) == uVar9))) {
              uVar16 = puVar15[1];
              (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              puVar6 = this->messageArray;
              puVar25 = puVar6 + (uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8
                                 | uVar16 << 0x18);
              uVar16 = this->messageLength;
              sVar11 = strlen(sourceText);
              sVar13 = strlen(context);
              sVar14 = strlen(comment);
              local_78 = 0;
              local_90 = (uchar *)0x0;
              local_5c = local_a4;
LAB_002a217f:
              if (puVar25 < puVar6 + uVar16) {
                switch(*puVar25) {
                case '\x01':
                  if (local_90 != (uchar *)0x0) {
                    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QString::QString(__return_storage_ptr__,local_78 >> 1,Uninitialized);
                    n_00 = (__return_storage_ptr__->d).size;
                    dest = QString::data(__return_storage_ptr__);
                    qbswap<2>(local_90,n_00,dest);
                    if ((__return_storage_ptr__->d).ptr != (char16_t *)0x0) goto LAB_002a22fd;
                    goto LAB_002a22dc;
                  }
                default:
                  goto switchD_002a219e_caseD_2;
                case '\x03':
                  uVar22 = *(uint *)(puVar25 + 1);
                  uVar10 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                           uVar22 << 0x18;
                  if ((uVar22 >> 0x18 & 1) != 0) goto switchD_002a219e_caseD_2;
                  bVar8 = local_5c == 0;
                  local_5c = local_5c + -1;
                  if (bVar8) {
                    local_78 = (ulong)uVar10;
                    local_90 = puVar25 + 5;
                  }
                  puVar25 = puVar25 + (long)(int)uVar10 + 5;
                  goto LAB_002a217f;
                case '\x05':
                  puVar25 = puVar25 + 5;
                  goto LAB_002a217f;
                case '\x06':
                  uVar22 = *(uint *)(puVar25 + 1);
                  foundLen = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18;
                  targetLen = (uint)sVar11;
                  pcVar18 = sourceText;
                  break;
                case '\a':
                  uVar22 = *(uint *)(puVar25 + 1);
                  foundLen = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18;
                  targetLen = (uint)sVar13;
                  pcVar18 = context;
                  break;
                case '\b':
                  uVar22 = *(uint *)(puVar25 + 1);
                  uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                           uVar22 << 0x18;
                  if ((puVar25[5] == '\0') ||
                     (bVar8 = ::match(puVar25 + 5,uVar22,comment,(uint)sVar14), bVar8))
                  goto LAB_002a21ee;
                  goto switchD_002a219e_caseD_2;
                }
                bVar8 = ::match(puVar25 + 5,foundLen,pcVar18,targetLen);
                if (!bVar8) goto switchD_002a219e_caseD_2;
                puVar25 = puVar25 + 5 + foundLen;
                goto LAB_002a217f;
              }
switchD_002a219e_caseD_2:
              (__return_storage_ptr__->d).d = (Data *)0x0;
              (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
              (__return_storage_ptr__->d).size = 0;
LAB_002a22dc:
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
              puVar15 = puVar15 + 2;
            }
          }
          pcVar18 = "";
        } while (*comment != '\0');
      }
      goto LAB_002a1e05;
    }
    puVar24 = (ushort *)this->contextArray;
    uVar27 = *puVar24 << 8 | *puVar24 >> 8;
    h = 0;
    elfHash_continue(context,&h);
    uVar2 = puVar24[(ulong)(h + (h == 0)) % (ulong)uVar27 + 1];
    if (uVar2 != 0) {
      sVar11 = strlen(context);
      for (puVar24 = puVar24 + (ulong)((uint)(ushort)(uVar2 << 8 | uVar2 >> 8) + (uint)uVar27) + 1;
          bVar1 = (byte)*puVar24, bVar1 != 0;
          puVar24 = (ushort *)((byte *)((long)puVar24 + 1) + (uint)bVar1)) {
        bVar8 = ::match((byte *)((long)puVar24 + 1),(uint)bVar1,context,(uint)sVar11);
        if (bVar8) goto LAB_002a1def;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_002a2346:
  __stack_chk_fail();
LAB_002a21ee:
  puVar25 = puVar25 + 5 + uVar22;
  goto LAB_002a217f;
LAB_002a22fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  goto LAB_002a2346;
}

Assistant:

QString QTranslatorPrivate::do_translate(const char *context, const char *sourceText,
                                         const char *comment, int n) const
{
    if (context == nullptr)
        context = "";
    if (sourceText == nullptr)
        sourceText = "";
    if (comment == nullptr)
        comment = "";

    uint numerus = 0;
    size_t numItems = 0;

    if (!offsetLength)
        goto searchDependencies;

    /*
        Check if the context belongs to this QTranslator. If many
        translators are installed, this step is necessary.
    */
    if (contextLength) {
        quint16 hTableSize = read16(contextArray);
        uint g = elfHash(context) % hTableSize;
        const uchar *c = contextArray + 2 + (g << 1);
        quint16 off = read16(c);
        c += 2;
        if (off == 0)
            return QString();
        c = contextArray + (2 + (hTableSize << 1) + (off << 1));

        const uint contextLen = uint(strlen(context));
        for (;;) {
            quint8 len = read8(c++);
            if (len == 0)
                return QString();
            if (match(c, len, context, contextLen))
                break;
            c += len;
        }
    }

    numItems = offsetLength / (2 * sizeof(quint32));
    if (!numItems)
        goto searchDependencies;

    if (n >= 0)
        numerus = numerusHelper(n, numerusRulesArray, numerusRulesLength);

    for (;;) {
        quint32 h = 0;
        elfHash_continue(sourceText, h);
        elfHash_continue(comment, h);
        elfHash_finish(h);

        const uchar *start = offsetArray;
        const uchar *end = start + ((numItems - 1) << 3);
        while (start <= end) {
            const uchar *middle = start + (((end - start) >> 4) << 3);
            uint hash = read32(middle);
            if (h == hash) {
                start = middle;
                break;
            } else if (hash < h) {
                start = middle + 8;
            } else {
                end = middle - 8;
            }
        }

        if (start <= end) {
            // go back on equal key
            while (start != offsetArray && read32(start) == read32(start - 8))
                start -= 8;

            while (start < offsetArray + offsetLength) {
                quint32 rh = read32(start);
                start += 4;
                if (rh != h)
                    break;
                quint32 ro = read32(start);
                start += 4;
                QString tn = getMessage(messageArray + ro, messageArray + messageLength, context,
                                        sourceText, comment, numerus);
                if (!tn.isNull())
                    return tn;
            }
        }
        if (!comment[0])
            break;
        comment = "";
    }

searchDependencies:
    for (const auto &translator : subTranslators) {
        QString tn = translator->translate(context, sourceText, comment, n);
        if (!tn.isNull())
            return tn;
    }
    return QString();
}